

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8 * google::protobuf::internal::WireFormat::InternalSerializeUnknownMessageSetItemsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target,EpsCopyOutputStream *stream)

{
  pointer pUVar1;
  int i;
  long lVar2;
  UnknownField *this;
  long lVar3;
  uint8 *local_38;
  
  lVar3 = 0;
  local_38 = target;
  for (lVar2 = 0;
      pUVar1 = (unknown_fields->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(unknown_fields->fields_).
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 4);
      lVar2 = lVar2 + 1) {
    if (*(int *)((long)&pUVar1->type_ + lVar3) == 3) {
      this = (UnknownField *)((long)&pUVar1->number_ + lVar3);
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
      local_38[0] = '\v';
      local_38[1] = '\x10';
      local_38 = local_38 + 2;
      local_38 = io::CodedOutputStream::WriteVarint32ToArray(this->number_,local_38);
      *local_38 = '\x1a';
      local_38 = local_38 + 1;
      local_38 = UnknownField::InternalSerializeLengthDelimitedNoTag(this,local_38,stream);
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
      *local_38 = '\f';
      target = local_38 + 1;
      local_38 = target;
    }
    lVar3 = lVar3 + 0x10;
  }
  return target;
}

Assistant:

uint8* WireFormat::InternalSerializeUnknownMessageSetItemsToArray(
    const UnknownFieldSet& unknown_fields, uint8* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      stream->EnsureSpace(&target);
      // Start group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemStartTag, target);

      // Write type ID.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetTypeIdTag, target);
      target =
          io::CodedOutputStream::WriteVarint32ToArray(field.number(), target);

      // Write message.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetMessageTag, target);

      target = field.InternalSerializeLengthDelimitedNoTag(target, stream);

      stream->EnsureSpace(&target);
      // End group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemEndTag, target);
    }
  }

  return target;
}